

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void __thiscall
TPZFMatrix<long_double>::Write(TPZFMatrix<long_double> *this,TPZStream *buf,int withclassid)

{
  undefined4 in_EDX;
  TPZBaseMatrix *in_RSI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  TPZBaseMatrix::Write
            (in_RSI,(TPZStream *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
             (int)((ulong)in_RDI >> 0x20));
  (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[9])
            (in_RSI,*(undefined8 *)(in_RDI + 0x20),
             (ulong)(uint)((int)*(undefined8 *)(in_RDI + 8) * (int)*(undefined8 *)(in_RDI + 0x10)));
  return;
}

Assistant:

void TPZFMatrix<TVar>::Write( TPZStream &buf, int withclassid ) const { //ok
    if constexpr (std::is_same<TVar, TFad<6, REAL>>::value ||
                  std::is_same<TVar, Fad<float>>::value ||
                  std::is_same<TVar, Fad<double>>::value ||
                  std::is_same<TVar, Fad<long double>>::value||
                  std::is_same<TVar, TPZFlopCounter>::value) {
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" not implemented for this type\n";
        PZError<<"Aborting...";
        DebugStop();
    }
    TPZMatrix<TVar>::Write(buf,withclassid);
    buf.Write(fElem,this->fRow*this->fCol);
}